

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::PixelUnpackBufferStorageTestCase::execute
          (PixelUnpackBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  uchar *value;
  ostringstream *this_00;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  GLenum GVar4;
  MessageBuilder *this_01;
  ulong uVar5;
  uchar uVar6;
  uint n_page;
  uint uVar7;
  ulong uVar8;
  uchar *puVar9;
  ulong uVar10;
  uchar *puVar11;
  int local_1d0;
  uint uStack_1cc;
  undefined1 auStack_1b0 [384];
  
  (*this->m_gl->bindBuffer)(0x88ec,this->m_sparse_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd93);
  (*this->m_gl->bindTexture)(0xde1,this->m_to);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd96);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xd99);
  this_00 = (ostringstream *)(auStack_1b0 + 8);
  local_1d0 = 0;
  (*this->m_gl->bufferPageCommitmentARB)(0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glBufferPageCommitmentARB() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xdac);
  (*this->m_gl->copyBufferSubData)(0x8f36,0x88ec,0,0,(ulong)this->m_texture_data_size);
  GVar4 = (*this->m_gl->getError)();
  glu::checkError(GVar4,"glCopyBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xdb1);
  do {
    uVar8 = 0;
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,this->m_to_data_zero);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde2);
    (*this->m_gl->texSubImage2D)
              (0xde1,0,0,0,this->m_to_width,this->m_to_height,0x1908,0x1401,(void *)0x0);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glTexSubImage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xde9);
    memset(this->m_read_data_ptr,0xff,(ulong)this->m_texture_data_size);
    (*this->m_gl->getTexImage)(0xde1,0,0x1908,0x1401,this->m_read_data_ptr);
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glGetTexImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xdf0);
    puVar11 = this->m_read_data_ptr;
    puVar9 = this->m_texture_data_ptr;
    bVar3 = true;
    uStack_1cc = 0;
    while ((uVar8 < this->m_to_height && (bVar3))) {
      uVar5 = 0;
      while ((uVar5 < this->m_to_width && (bVar3))) {
        uVar10 = 0;
        while ((value = puVar9 + uVar10, uVar10 < 4 && (bVar3))) {
          if ((local_1d0 == 2) ||
             ((local_1d0 == 1 &&
              (((uStack_1cc + uVar10 & 0xffffffff) / (ulong)(uint)this->m_page_size & 1) != 0)))) {
            if (puVar11[uVar10] != '\0') {
              uVar6 = '\0';
              goto LAB_00acc02e;
            }
          }
          else {
            uVar6 = *value;
            if (uVar6 != puVar11[uVar10]) {
LAB_00acc02e:
              auStack_1b0._0_8_ = this->m_testCtx->m_log;
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::operator<<((ostream *)this_00,"Invalid texel data (channel:");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,") found at X:");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,", Y:");
              std::ostream::_M_insert<unsigned_long>((ulong)this_00);
              std::operator<<((ostream *)this_00,"). Expected value:");
              std::operator<<((ostream *)this_00,uVar6);
              std::operator<<((ostream *)this_00,", found value:");
              this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)auStack_1b0,(char *)value)
              ;
              tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              bVar3 = false;
            }
          }
          uVar10 = uVar10 + 1;
        }
        uVar5 = uVar5 + 1;
        uStack_1cc = uStack_1cc + (int)uVar10;
        puVar11 = puVar11 + uVar10;
        puVar9 = value;
      }
      uVar8 = uVar8 + 1;
    }
    (*this->m_gl->bufferPageCommitmentARB)(0x88ec,0,(ulong)this->m_sparse_bo_size_rounded,'\0');
    GVar4 = (*this->m_gl->getError)();
    glu::checkError(GVar4,"glBufferPageCommitmentARB() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xe2b);
    local_1d0 = local_1d0 + 1;
    uVar1 = this->m_texture_data_size;
    uVar2 = this->m_page_size;
    for (uVar7 = 0; uVar7 < uVar1 / uVar2; uVar7 = uVar7 + 1) {
      (*this->m_gl->bufferPageCommitmentARB)
                (0x88ec,(ulong)(this->m_page_size * uVar7),(long)this->m_page_size,~(byte)uVar7 & 1)
      ;
      GVar4 = (*this->m_gl->getError)();
      glu::checkError(GVar4,"glBufferPageCommitmentARB() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                      ,0xdc0);
      if ((uVar7 & 1) == 0) {
        uVar8 = (ulong)(this->m_page_size * uVar7);
        (*this->m_gl->copyBufferSubData)(0x8f36,0x88ec,uVar8,uVar8,(long)this->m_page_size);
        GVar4 = (*this->m_gl->getError)();
        glu::checkError(GVar4,"glCopyBufferSubData() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                        ,0xdc8);
      }
    }
  } while( true );
}

Assistant:

bool PixelUnpackBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	m_gl.bindBuffer(GL_PIXEL_UNPACK_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bindTexture(GL_TEXTURE_2D, m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	/* Run three separate iterations:
	 *
	 * a) All pages holding the source texture data are committed.
	 * b) Use a zig-zag memory page commitment layout patern.
	 * b) No pages are committed.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		bool result_local = true;

		/* Set up the memory page commitment & the storage contents*/
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

			m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER, 0, /* readOffset */
								   0,											   /* writeOffset */
								   m_texture_data_size);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");

			break;
		}

		case 1:
		{
			const unsigned int n_pages = m_texture_data_size / m_page_size;

			for (unsigned int n_page = 0; n_page < n_pages; ++n_page)
			{
				const bool should_commit = ((n_page % 2) == 0);

				m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, m_page_size * n_page, m_page_size,
											 should_commit ? GL_TRUE : GL_FALSE);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");

				if (should_commit)
				{
					m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_PIXEL_UNPACK_BUFFER,
										   m_page_size * n_page, /* readOffset */
										   m_page_size * n_page, /* writeOffset */
										   m_page_size);
					GLU_EXPECT_NO_ERROR(m_gl.getError(), "glCopyBufferSubData() call failed.");
				}
			} /* for (all relevant memory pages) */

			break;
		}

		case 2:
		{
			/* Do nothing */
			break;
		}

		default:
		{
			TCU_FAIL("Invalid iteration index");
		}
		} /* switch (n_iteration) */

		/* Clean up the base mip-map's contents before we proceeding with updating it
		 * with data downloaded from the BO, in order to avoid situation where silently
		 * failing glTexSubImage2D() calls slip past unnoticed */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, m_to_data_zero);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Update the base mip-map's contents */
		m_gl.texSubImage2D(GL_TEXTURE_2D, 0, /* level */
						   0,				 /* xoffset */
						   0,				 /* yoffset */
						   m_to_width, m_to_height, GL_RGBA, GL_UNSIGNED_BYTE, (const glw::GLvoid*)0);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glTexSubImage2D() call failed.");

		/* Read back the stored mip-map data */
		memset(m_read_data_ptr, 0xFF, m_texture_data_size);

		m_gl.getTexImage(GL_TEXTURE_2D, 0, /* level */
						 GL_RGBA, GL_UNSIGNED_BYTE, m_read_data_ptr);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetTexImage() call failed.");

		/* Verify the data */
		unsigned int n_current_tex_data_byte	= 0;
		const char*  read_data_traveller_ptr	= (const char*)m_read_data_ptr;
		const char*  texture_data_traveller_ptr = (const char*)m_texture_data_ptr;

		for (unsigned int y = 0; y < m_to_height && result_local; ++y)
		{
			for (unsigned int x = 0; x < m_to_width && result_local; ++x)
			{
				for (unsigned int n_component = 0; n_component < 4 /* rgba */ && result_local; ++n_component)
				{
					char expected_value			= 0;
					bool is_from_committed_page = true;

					if (n_iteration == 1) /* zig-zag */
					{
						is_from_committed_page = ((n_current_tex_data_byte / m_page_size) % 2) == 0;
					}
					else if (n_iteration == 2) /* no pages committed */
					{
						is_from_committed_page = false;
					}

					if (is_from_committed_page)
					{
						expected_value = *texture_data_traveller_ptr;
					}

					if ((is_from_committed_page && de::abs(expected_value - *read_data_traveller_ptr) >= 1) ||
						(!is_from_committed_page && *read_data_traveller_ptr != expected_value))
					{
						m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel data (channel:" << n_component
										   << ")"
											  " found at X:"
										   << x << ", "
												   "Y:"
										   << y << ")."
												   " Expected value:"
										   << expected_value << ","
																" found value:"
										   << *texture_data_traveller_ptr << tcu::TestLog::EndMessage;

						result_local = false;
					}

					n_current_tex_data_byte++;
					read_data_traveller_ptr++;
					texture_data_traveller_ptr++;
				} /* for (all components) */
			}	 /* for (all columns) */
		}		  /* for (all rows) */

		result &= result_local;

		/* Clean up */
		m_gl.bufferPageCommitmentARB(GL_PIXEL_UNPACK_BUFFER, 0,			  /* offset */
									 m_sparse_bo_size_rounded, GL_FALSE); /* commit */
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call failed.");
	} /* for (three iterations) */

	return result;
}